

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_set_list(t_array_rangeop *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _array *a;
  t_float *ptVar2;
  int which;
  t_float tVar3;
  int stride;
  char *firstitem;
  int arrayonset;
  _glist *glist;
  int local_58;
  int local_54;
  t_array_rangeop *local_50;
  t_float *local_48;
  int local_3c;
  _glist *local_38;
  
  iVar1 = array_rangeop_getrange(x,(char **)&local_48,&local_58,&local_54,&local_3c);
  if (iVar1 != 0) {
    if (argc <= local_58) {
      local_58 = argc;
    }
    which = 0;
    ptVar2 = local_48;
    local_50 = x;
    iVar1 = local_58;
    if (local_58 < 1) {
      iVar1 = which;
    }
    for (; iVar1 != which; which = which + 1) {
      tVar3 = atom_getfloatarg(which,argc,argv);
      *ptVar2 = tVar3;
      ptVar2 = (t_float *)((long)ptVar2 + (long)local_54);
    }
    local_38 = (_glist *)0x0;
    a = array_client_getbuf(&local_50->x_tc,&local_38);
    if (local_38 != (_glist *)0x0) {
      array_redraw(a,local_38);
    }
  }
  return;
}

Assistant:

static void array_set_list(t_array_rangeop *x, t_symbol *s,
    int argc, t_atom *argv)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    if (nitem > argc)
        nitem = argc;
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        *(t_float *)itemp = atom_getfloatarg(i, argc, argv);
    array_client_senditup(&x->x_tc);
}